

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal.h
# Opt level: O0

__sighandler_t __thiscall
obs::signal<void_(int)>::~signal(signal<void_(int)> *this,int __sig,__sighandler_t __handler)

{
  bool bVar1;
  slot<void_(int)> *psVar2;
  __sighandler_t extraout_RAX;
  slot<void_(int)> *slot;
  iterator __end0;
  iterator __begin0;
  slot_list *__range2;
  signal<void_(int)> *this_local;
  
  (this->super_signal_base)._vptr_signal_base = (_func_int **)&PTR__signal_00116b48;
  safe_list<obs::slot<void_(int)>_>::begin((iterator *)&__end0.m_next_iterator,&this->m_slots);
  safe_list<obs::slot<void_(int)>_>::end((iterator *)&slot,&this->m_slots);
  while( true ) {
    bVar1 = safe_list<obs::slot<void_(int)>_>::iterator::operator!=
                      ((iterator *)&__end0.m_next_iterator,(iterator *)&slot);
    if (!bVar1) break;
    psVar2 = safe_list<obs::slot<void_(int)>_>::iterator::operator*
                       ((iterator *)&__end0.m_next_iterator);
    if (psVar2 != (slot<void_(int)> *)0x0) {
      (*(psVar2->super_slot_base)._vptr_slot_base[1])();
    }
    safe_list<obs::slot<void_(int)>_>::iterator::operator++((iterator *)&__end0.m_next_iterator);
  }
  safe_list<obs::slot<void_(int)>_>::iterator::~iterator((iterator *)&slot);
  safe_list<obs::slot<void_(int)>_>::iterator::~iterator((iterator *)&__end0.m_next_iterator);
  safe_list<obs::slot<void_(int)>_>::~safe_list(&this->m_slots);
  signal_base::~signal_base(&this->super_signal_base);
  return extraout_RAX;
}

Assistant:

~signal() {
    for (auto slot : m_slots)
      delete slot;
  }